

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGui::BeginDocked(ImGui *this,ImGuiWindow_conflict *window,bool *p_open)

{
  ImGuiContext_conflict1 *ctx;
  ImGuiContext_conflict1 *pIVar1;
  ImU32 IVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ImGuiContext_conflict1 *g_1;
  void *pvVar6;
  ImGuiDockNode *node;
  ImGuiDockNode *node_00;
  char cVar7;
  ImGui extraout_DL;
  ImGui IVar8;
  ImGui extraout_DL_00;
  ImGui extraout_DL_01;
  ImGui extraout_DL_02;
  ImGuiID IVar9;
  long lVar10;
  ImGuiDockNode *pIVar11;
  ImGuiDockNode *node_01;
  ImGuiContext_conflict1 *g;
  
  ctx = GImGui;
  IVar8 = SUB81(p_open,0);
  this[0x3e1] = (ImGui)((byte)this[0x3e1] & 0xf8);
  if (((ctx->IO).ConfigDockingAlwaysTabBar == false) && (this[0x2c] == (ImGui)0x0)) {
    uVar5 = *(uint *)(this + 0xc);
LAB_00193909:
    cVar7 = '\0';
    if ((((ctx->NextWindowData).Flags & 1) != 0) &&
       (IVar8 = this[0xec], ((ctx->NextWindowData).PosCond & (int)(char)IVar8) != 0)) {
      cVar7 = (ctx->NextWindowData).PosUndock;
    }
    if (cVar7 != '\0' || (uVar5 >> 0x15 & 1) != 0) goto LAB_00193937;
  }
  else {
    uVar5 = *(uint *)(this + 0xc);
    if (((uVar5 & 0x1200001) != 0) || (this[0xcf] != (ImGui)0x0)) goto LAB_00193909;
    if (*(int *)(this + 0x410) == 0) {
      if (*(long *)(this + 0x400) != 0) {
        __assert_fail("window->DockNode == __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                      ,0x3e56,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
      }
      IVar9 = 0;
      do {
        IVar9 = IVar9 + 1;
        pvVar6 = ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,IVar9);
      } while (pvVar6 != (void *)0x0);
      *(ImGuiID *)(this + 0x410) = IVar9;
      IVar8 = extraout_DL;
    }
  }
  node = *(ImGuiDockNode **)(this + 0x400);
  IVar9 = *(ImGuiID *)(this + 0x410);
  if (node == (ImGuiDockNode *)0x0) {
    if (IVar9 == 0) {
      node = (ImGuiDockNode *)0x0;
    }
    else {
      node = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,IVar9);
      if (node == (ImGuiDockNode *)0x0) {
        node = DockContextAddNode(ctx,IVar9);
        uVar5 = *(uint *)&node->field_0xbc & 0xfffffe00 | 0x92;
        *(short *)&node->field_0xbc = (short)uVar5;
        node->LastFrameAlive = ctx->FrameCount;
      }
      else {
        IVar8 = extraout_DL_01;
        if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) goto LAB_00193937;
        uVar5 = (uint)*(ushort *)&node->field_0xbc;
      }
      pIVar11 = node;
      if ((uVar5 >> 9 & 1) == 0) {
        do {
          *(ushort *)&pIVar11->field_0xbc = (ushort)uVar5 | 0x200;
          pIVar11->field_0xbe = pIVar11->field_0xbe | 8;
          node_01 = pIVar11->ParentNode;
          if (pIVar11->ParentNode == (ImGuiDockNode *)0x0) {
            node_01 = pIVar11;
          }
          uVar5 = *(uint *)&node_01->field_0xbc;
          pIVar11 = node_01;
        } while ((uVar5 >> 9 & 1) == 0);
        if (((node_01->Size).x <= 0.0) || ((node_01->Size).y <= 0.0)) {
          __assert_fail("ancestor_node->Size.x > 0.0f && ancestor_node->Size.y > 0.0f",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                        ,0x3e3e,
                        "ImGuiDockNode *ImGui::DockContextBindNodeToWindow(ImGuiContext *, ImGuiWindow *)"
                       );
        }
        do {
          node_00 = pIVar11;
          pIVar11 = node_00->ParentNode;
        } while (pIVar11 != (ImGuiDockNode *)0x0);
        DockNodeUpdateHasCentralNodeChild(node_00);
        DockNodeTreeUpdatePosSize(node_01,node_01->Pos,node_01->Size,true);
      }
      DockNodeAddWindow(node,(ImGuiWindow_conflict *)this,true);
      if (node != *(ImGuiDockNode **)(this + 0x400)) {
        __assert_fail("node == window->DockNode",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                      ,0x3e45,
                      "ImGuiDockNode *ImGui::DockContextBindNodeToWindow(ImGuiContext *, ImGuiWindow *)"
                     );
      }
      IVar8 = extraout_DL_02;
      if (node == (ImGuiDockNode *)0x0) {
        return;
      }
    }
  }
  else if (IVar9 != node->ID) {
    __assert_fail("window->DockId == node->ID",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3e6a,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
  }
  if (node->LastFrameAlive < ctx->FrameCount) {
    do {
      pIVar11 = node;
      node = pIVar11->ParentNode;
    } while (node != (ImGuiDockNode *)0x0);
    if (ctx->FrameCount <= pIVar11->LastFrameAlive) {
      this[0x3e1] = (ImGui)((byte)this[0x3e1] | 1);
      return;
    }
LAB_00193937:
    DockContextProcessUndockWindow
              ((ImGuiContext_conflict1 *)this,(ImGuiWindow_conflict *)0x1,(bool)IVar8);
    return;
  }
  lVar10 = 0;
  do {
    IVar2 = ColorConvertFloat4ToU32
                      ((ctx->Style).Colors + *(int *)((long)GWindowDockStyleColors + lVar10));
    *(ImU32 *)(this + lVar10 + 0x3e4) = IVar2;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x18);
  if (node->HostWindow == (ImGuiWindow_conflict *)0x0) {
    if (node->State == ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing) {
      this[0x3e1] = (ImGui)((byte)this[0x3e1] | 1);
    }
    if ((node->Windows).Size < 2) {
      return;
    }
    this[0xce] = (ImGui)0x1;
    this[0xe8] = (ImGui)('\x02' - (char)this[199]);
    return;
  }
  if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
    __assert_fail("node->IsLeafNode()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3e9a,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
  }
  if (((node->Size).x < 0.0) || ((node->Size).y < 0.0)) {
    __assert_fail("node->Size.x >= 0.0f && node->Size.y >= 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3e9b,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
  }
  node->State = ImGuiDockNodeState_HostWindowVisible;
  pIVar1 = GImGui;
  IVar8 = extraout_DL_00;
  if (*(short *)(this + 0xd6) < node->HostWindow->BeginOrderWithinContext) goto LAB_00193937;
  uVar5 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = uVar5 | 1;
  (pIVar1->NextWindowData).PosVal = node->Pos;
  (pIVar1->NextWindowData).PosPivotVal.x = 0.0;
  (pIVar1->NextWindowData).PosPivotVal.y = 0.0;
  (pIVar1->NextWindowData).PosCond = 1;
  (pIVar1->NextWindowData).PosUndock = true;
  (pIVar1->NextWindowData).Flags = uVar5 | 3;
  (pIVar1->NextWindowData).SizeVal = node->Size;
  (pIVar1->NextWindowData).SizeCond = 1;
  (ctx->NextWindowData).PosUndock = false;
  IVar8 = this[0x3e1];
  this[0x3e1] = (ImGui)((byte)IVar8 & 0xf8 | 3);
  if ((node->MergedFlags & 1) != 0) {
    return;
  }
  if (node->VisibleWindow == (ImGuiWindow_conflict *)this) {
    this[0x3e1] = (ImGui)((byte)IVar8 | 7);
  }
  uVar5 = *(uint *)(this + 0xc);
  if ((uVar5 >> 0x18 & 1) != 0) {
    __assert_fail("(window->Flags & ImGuiWindowFlags_ChildWindow) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3eb4,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
  }
  uVar3 = uVar5 | 0x1010003;
  if ((node->MergedFlags & 0x3000U) == 0) {
    uVar3 = uVar5 & 0xfefefffc | 0x1010002;
  }
  *(uint *)(this + 0xc) = uVar3;
  if ((node->TabBar != (ImGuiTabBar *)0x0) && (this[200] == (ImGui)0x1)) {
    iVar4 = DockNodeGetTabOrder((ImGuiWindow_conflict *)this);
    *(short *)(this + 0x3e2) = (short)iVar4;
  }
  if ((node->field_0xbd & 0x40) == 0) {
    if ((window == (ImGuiWindow_conflict *)0x0) || (node->WantCloseTabId != *(ImGuiID *)(this + 8)))
    goto LAB_00193cad;
  }
  else if (window == (ImGuiWindow_conflict *)0x0) goto LAB_00193cad;
  *(undefined1 *)&window->Name = 0;
LAB_00193cad:
  IVar9 = ImGuiWindow::GetID(*(ImGuiWindow **)(*(long *)(this + 0x400) + 0x80),*(char **)this,
                             (char *)0x0);
  *(ImGuiID *)(this + 0x90) = IVar9;
  return;
}

Assistant:

void ImGui::BeginDocked(ImGuiWindow* window, bool* p_open)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;

    // Clear fields ahead so most early-out paths don't have to do it
    window->DockIsActive = window->DockNodeIsVisible = window->DockTabIsVisible = false;

    const bool auto_dock_node = GetWindowAlwaysWantOwnTabBar(window);
    if (auto_dock_node)
    {
        if (window->DockId == 0)
        {
            IM_ASSERT(window->DockNode == NULL);
            window->DockId = DockContextGenNodeID(ctx);
        }
    }
    else
    {
        // Calling SetNextWindowPos() undock windows by default (by setting PosUndock)
        bool want_undock = false;
        want_undock |= (window->Flags & ImGuiWindowFlags_NoDocking) != 0;
        want_undock |= (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) && (window->SetWindowPosAllowFlags & g.NextWindowData.PosCond) && g.NextWindowData.PosUndock;
        if (want_undock)
        {
            DockContextProcessUndockWindow(ctx, window);
            return;
        }
    }

    // Bind to our dock node
    ImGuiDockNode* node = window->DockNode;
    if (node != NULL)
        IM_ASSERT(window->DockId == node->ID);
    if (window->DockId != 0 && node == NULL)
    {
        node = DockContextBindNodeToWindow(ctx, window);
        if (node == NULL)
            return;
    }

#if 0
    // Undock if the ImGuiDockNodeFlags_NoDockingInCentralNode got set
    if (node->IsCentralNode && (node->Flags & ImGuiDockNodeFlags_NoDockingInCentralNode))
    {
        DockContextProcessUndockWindow(ctx, window);
        return;
    }
#endif

    // Undock if our dockspace node disappeared
    // Note how we are testing for LastFrameAlive and NOT LastFrameActive. A DockSpace node can be maintained alive while being inactive with ImGuiDockNodeFlags_KeepAliveOnly.
    if (node->LastFrameAlive < g.FrameCount)
    {
        // If the window has been orphaned, transition the docknode to an implicit node processed in DockContextNewFrameUpdateDocking()
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        if (root_node->LastFrameAlive < g.FrameCount)
            DockContextProcessUndockWindow(ctx, window);
        else
            window->DockIsActive = true;
        return;
    }

    // Store style overrides
    for (int color_n = 0; color_n < ImGuiWindowDockStyleCol_COUNT; color_n++)
        window->DockStyle.Colors[color_n] = ColorConvertFloat4ToU32(g.Style.Colors[GWindowDockStyleColors[color_n]]);

    // Fast path return. It is common for windows to hold on a persistent DockId but be the only visible window,
    // and never create neither a host window neither a tab bar.
    // FIXME-DOCK: replace ->HostWindow NULL compare with something more explicit (~was initially intended as a first frame test)
    if (node->HostWindow == NULL)
    {
        if (node->State == ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing)
            window->DockIsActive = true;
        if (node->Windows.Size > 1)
            DockNodeHideWindowDuringHostWindowCreation(window);
        return;
    }

    // We can have zero-sized nodes (e.g. children of a small-size dockspace)
    IM_ASSERT(node->HostWindow);
    IM_ASSERT(node->IsLeafNode());
    IM_ASSERT(node->Size.x >= 0.0f && node->Size.y >= 0.0f);
    node->State = ImGuiDockNodeState_HostWindowVisible;

    // Undock if we are submitted earlier than the host window
    if (window->BeginOrderWithinContext < node->HostWindow->BeginOrderWithinContext)
    {
        DockContextProcessUndockWindow(ctx, window);
        return;
    }

    // Position/Size window
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false; // Cancel implicit undocking of SetNextWindowPos()
    window->DockIsActive = true;
    window->DockNodeIsVisible = true;
    window->DockTabIsVisible = false;
    if (node->MergedFlags & ImGuiDockNodeFlags_KeepAliveOnly)
        return;

    // When the window is selected we mark it as visible.
    if (node->VisibleWindow == window)
        window->DockTabIsVisible = true;

    // Update window flag
    IM_ASSERT((window->Flags & ImGuiWindowFlags_ChildWindow) == 0);
    window->Flags |= ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysUseWindowPadding | ImGuiWindowFlags_NoResize;
    if (node->IsHiddenTabBar() || node->IsNoTabBar())
        window->Flags |= ImGuiWindowFlags_NoTitleBar;
    else
        window->Flags &= ~ImGuiWindowFlags_NoTitleBar;      // Clear the NoTitleBar flag in case the user set it: confusingly enough we need a title bar height so we are correctly offset, but it won't be displayed!

    // Save new dock order only if the window has been visible once already
    // This allows multiple windows to be created in the same frame and have their respective dock orders preserved.
    if (node->TabBar && window->WasActive)
        window->DockOrder = (short)DockNodeGetTabOrder(window);

    if ((node->WantCloseAll || node->WantCloseTabId == window->ID) && p_open != NULL)
        *p_open = false;

    // Update ChildId to allow returning from Child to Parent with Escape
    ImGuiWindow* parent_window = window->DockNode->HostWindow;
    window->ChildId = parent_window->GetID(window->Name);
}